

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserProbModelXML.cpp
# Opt level: O1

string * __thiscall
ParserProbModelXML::GetVariableComment_abi_cxx11_
          (string *__return_storage_ptr__,ParserProbModelXML *this,xmlNodePtr node)

{
  char *pcVar1;
  xmlXPathObjectPtr pxVar2;
  char *__s;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  pxVar2 = GetNodesMatchingExpression(this,(xmlChar *)"Comment",node);
  if (pxVar2 != (xmlXPathObjectPtr)0x0) {
    __s = (char *)xmlNodeListGetString(this->_m_doc,(*pxVar2->nodesetval->nodeTab)->children,1);
    pcVar1 = (char *)__return_storage_ptr__->_M_string_length;
    strlen(__s);
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,pcVar1,(ulong)__s);
    xmlXPathFreeObject(pxVar2);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string ParserProbModelXML::GetVariableComment(const xmlNodePtr node)
{
    //only works for plain text comments so far.
    string comment = "";
    xmlXPathObjectPtr comment_node = GetNodesMatchingExpression((xmlChar*) "Comment",node);
    if(comment_node != NULL)
    {
        comment = (char*) xmlNodeListGetString(GetDoc(), comment_node->nodesetval->nodeTab[0]->xmlChildrenNode, 1);
        if(DEBUG_PARSE)
        {
            cout << "read comment: " << comment << endl;
        }
        xmlXPathFreeObject (comment_node);
    }
    return comment;
}